

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TiledRgbaOutputFile::TiledRgbaOutputFile
          (TiledRgbaOutputFile *this,char *name,int tileXSize,int tileYSize,LevelMode mode,
          LevelRoundingMode rmode,Box2i *displayWindow,Box2i *dataWindow,RgbaChannels rgbaChannels,
          float pixelAspectRatio,V2f *screenWindowCenter,float screenWindowWidth,LineOrder lineOrder
          ,Compression compression,int numThreads)

{
  bool bVar1;
  V2f VVar2;
  uint in_ECX;
  uint in_EDX;
  V2f *in_RDI;
  LevelMode in_R8D;
  LevelRoundingMode in_R9D;
  Header *in_stack_00000008;
  Header *in_stack_00000010;
  uint in_stack_00000018;
  undefined8 in_stack_00000020;
  Header hd;
  int in_stack_0000017c;
  Header *in_stack_00000180;
  undefined4 in_stack_00000188;
  RgbaChannels in_stack_0000018c;
  Header *in_stack_00000190;
  Header *td;
  Header *in_stack_ffffffffffffff80;
  Box2i *in_stack_ffffffffffffff88;
  LevelRoundingMode in_stack_ffffffffffffff90;
  RgbaChannels in_stack_ffffffffffffff94;
  TiledOutputFile *in_stack_ffffffffffffff98;
  ToYa *in_stack_ffffffffffffffa0;
  
  *in_RDI = (V2f)&PTR__TiledRgbaOutputFile_002ad4d0;
  in_RDI[1].x = 0.0;
  in_RDI[1].y = 0.0;
  in_RDI[2].x = 0.0;
  in_RDI[2].y = 0.0;
  td = in_stack_00000008;
  bVar1 = Imath_3_2::Box<Imath_3_2::Vec2<int>_>::isEmpty
                    ((Box<Imath_3_2::Vec2<int>_> *)in_stack_00000010);
  if (!bVar1) {
    in_stack_00000008 = in_stack_00000010;
  }
  Header::Header((Header *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88,(Box2i *)in_stack_ffffffffffffff80,
                 (float)((ulong)td >> 0x20),in_RDI,(float)((ulong)in_stack_00000020 >> 0x20),
                 (LineOrder)in_stack_00000020,(Compression)((ulong)in_stack_00000008 >> 0x20));
  anon_unknown_23::insertChannels(in_stack_00000190,in_stack_0000018c,(char *)in_stack_00000180);
  TileDescription::TileDescription
            ((TileDescription *)&stack0xffffffffffffff84,in_EDX,in_ECX,in_R8D,in_R9D);
  Header::setTileDescription(in_stack_ffffffffffffff80,(TileDescription *)td);
  VVar2 = (V2f)operator_new(0x20);
  TiledOutputFile::TiledOutputFile
            ((TiledOutputFile *)in_stack_00000190,
             (char *)CONCAT44(in_stack_0000018c,in_stack_00000188),in_stack_00000180,
             in_stack_0000017c);
  in_RDI[1] = VVar2;
  if ((in_stack_00000018 & 0x10) != 0) {
    VVar2 = (V2f)operator_new(0x78);
    ToYa::ToYa(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
    in_RDI[2] = VVar2;
  }
  Header::~Header(in_stack_00000008);
  return;
}

Assistant:

TiledRgbaOutputFile::TiledRgbaOutputFile (
    const char                    name[],
    int                           tileXSize,
    int                           tileYSize,
    LevelMode                     mode,
    LevelRoundingMode             rmode,
    const IMATH_NAMESPACE::Box2i& displayWindow,
    const IMATH_NAMESPACE::Box2i& dataWindow,
    RgbaChannels                  rgbaChannels,
    float                         pixelAspectRatio,
    const IMATH_NAMESPACE::V2f    screenWindowCenter,
    float                         screenWindowWidth,
    LineOrder                     lineOrder,
    Compression                   compression,
    int                           numThreads)
    : _outputFile (0), _toYa (0)
{
    Header hd (
        displayWindow,
        dataWindow.isEmpty () ? displayWindow : dataWindow,
        pixelAspectRatio,
        screenWindowCenter,
        screenWindowWidth,
        lineOrder,
        compression);

    insertChannels (hd, rgbaChannels, name);
    hd.setTileDescription (TileDescription (tileXSize, tileYSize, mode, rmode));
    _outputFile = new TiledOutputFile (name, hd, numThreads);

    if (rgbaChannels & WRITE_Y) _toYa = new ToYa (*_outputFile, rgbaChannels);
}